

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O3

void CVmBifTIO::flush_output(uint argc)

{
  CVmBif::check_argc(argc,0);
  CVmConsole::flush(&G_console_X->super_CVmConsole,VM_NL_NONE);
  CVmConsole::update_display(&G_console_X->super_CVmConsole);
  return;
}

Assistant:

void CVmBifTIO::flush_output(VMG_ uint argc)
{
    /* we take no arguments */
    check_argc(vmg_ argc, 0);

    /* flush output */
    G_console->flush(vmg_ VM_NL_NONE);

    /* immediately update the display */
    G_console->update_display(vmg0_);
}